

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

int assert_str_eq(char *a,char *b,char *testcase,int line)

{
  int iVar1;
  uint in_ECX;
  undefined8 in_RDX;
  char *in_RSI;
  char *in_RDI;
  int err;
  
  test_counter = test_counter + 1;
  iVar1 = strcmp(in_RDI,in_RSI);
  if (iVar1 == 0) {
    printf("ok %d - %s...\n",(ulong)(uint)test_counter,in_RDX);
  }
  else {
    printf("not ok %d - %s...\n",(ulong)(uint)test_counter,in_RDX);
    printf("# Expected \'%s\', but observed \'%s\' instead (line %d)\n",in_RDI,in_RSI,(ulong)in_ECX)
    ;
    global_err = global_err + 1;
  }
  return iVar1;
}

Assistant:

int assert_str_eq(const char *a, const char *b, const char *testcase, int line)
{
    test_counter++;
    int err = strcmp(a,b);
    if(err) {
        printf("not ok %d - %s...\n", test_counter, testcase);
        printf("# Expected '%s', but observed '%s' instead (line %d)\n", a, b, line);
        global_err++;
    } else
        printf("ok %d - %s...\n", test_counter, testcase);
    return err;
}